

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

QAction * __thiscall
QMenu::addAction(QMenu *this,QIcon *icon,QString *text,QObject *receiver,char *member,
                QKeySequence *shortcut)

{
  QAction *this_00;
  long in_FS_OFFSET;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAction *)operator_new(0x10);
  QAction::QAction(this_00,icon,(QString *)text,(QObject *)this);
  QAction::setShortcut((QKeySequence *)this_00);
  QObject::connect(local_40,(char *)this_00,(QObject *)"2triggered(bool)",(char *)receiver,
                   (ConnectionType)member);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QWidget::addAction(&this->super_QWidget,this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QMenu::addAction(const QIcon &icon, const QString &text, const QObject *receiver,
                          const char* member, const QKeySequence &shortcut)
{
    QAction *action = new QAction(icon, text, this);
    action->setShortcut(shortcut);
    QObject::connect(action, SIGNAL(triggered(bool)), receiver, member);
    addAction(action);
    return action;
}